

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

size_t __thiscall ODDLParser::Value::size(Value *this)

{
  size_t sVar1;
  
  sVar1 = 0;
  do {
    this = this->m_next;
    sVar1 = sVar1 + 1;
  } while (this != (Value *)0x0);
  return sVar1;
}

Assistant:

size_t Value::size() const{
    size_t result=1;
    Value *n=m_next;
    while( n!=ddl_nullptr) {
        result++;
        n=n->m_next;
    }
    return result;
}